

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system_metric.hpp
# Opt level: O2

void ylt::metric::detail::process_status(void)

{
  int iVar1;
  FILE *pFVar2;
  atomic<long> *paVar3;
  string *psVar4;
  shared_ptr<_IO_FILE> stream_file;
  ProcStat stat;
  
  if (process_status()::process_uptime == '\0') {
    iVar1 = __cxa_guard_acquire(&process_status()::process_uptime);
    if (iVar1 != 0) {
      psVar4 = (string *)static_metric_manager<ylt::metric::ylt_system_tag_t>::instance();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&stat,"ylt_process_uptime",(allocator<char> *)&stream_file);
      static_metric_manager<ylt::metric::ylt_system_tag_t>::
      get_metric_static<ylt::metric::basic_static_counter<long>>
                ((static_metric_manager<ylt::metric::ylt_system_tag_t> *)
                 &process_status::process_uptime,psVar4);
      std::__cxx11::string::~string((string *)&stat);
      __cxa_atexit(std::
                   __shared_ptr<ylt::metric::basic_static_counter<long>,_(__gnu_cxx::_Lock_policy)2>
                   ::~__shared_ptr,&process_status::process_uptime,&__dso_handle);
      __cxa_guard_release(&process_status()::process_uptime);
    }
  }
  if (process_status()::process_priority == '\0') {
    iVar1 = __cxa_guard_acquire(&process_status()::process_priority);
    if (iVar1 != 0) {
      psVar4 = (string *)static_metric_manager<ylt::metric::ylt_system_tag_t>::instance();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&stat,"ylt_process_priority",(allocator<char> *)&stream_file);
      static_metric_manager<ylt::metric::ylt_system_tag_t>::
      get_metric_static<ylt::metric::basic_static_gauge<long>>
                ((static_metric_manager<ylt::metric::ylt_system_tag_t> *)
                 &process_status::process_priority,psVar4);
      std::__cxx11::string::~string((string *)&stat);
      __cxa_atexit(std::
                   __shared_ptr<ylt::metric::basic_static_gauge<long>,_(__gnu_cxx::_Lock_policy)2>::
                   ~__shared_ptr,&process_status::process_priority,&__dso_handle);
      __cxa_guard_release(&process_status()::process_priority);
    }
  }
  if (process_status()::pid == '\0') {
    iVar1 = __cxa_guard_acquire(&process_status()::pid);
    if (iVar1 != 0) {
      psVar4 = (string *)static_metric_manager<ylt::metric::ylt_system_tag_t>::instance();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&stat,"ylt_pid",(allocator<char> *)&stream_file);
      static_metric_manager<ylt::metric::ylt_system_tag_t>::
      get_metric_static<ylt::metric::basic_static_gauge<long>>
                ((static_metric_manager<ylt::metric::ylt_system_tag_t> *)&process_status::pid,psVar4
                );
      std::__cxx11::string::~string((string *)&stat);
      __cxa_atexit(std::
                   __shared_ptr<ylt::metric::basic_static_gauge<long>,_(__gnu_cxx::_Lock_policy)2>::
                   ~__shared_ptr,&process_status::pid,&__dso_handle);
      __cxa_guard_release(&process_status()::pid);
    }
  }
  if (process_status()::ppid == '\0') {
    iVar1 = __cxa_guard_acquire(&process_status()::ppid);
    if (iVar1 != 0) {
      psVar4 = (string *)static_metric_manager<ylt::metric::ylt_system_tag_t>::instance();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&stat,"ylt_ppid",(allocator<char> *)&stream_file);
      static_metric_manager<ylt::metric::ylt_system_tag_t>::
      get_metric_static<ylt::metric::basic_static_gauge<long>>
                ((static_metric_manager<ylt::metric::ylt_system_tag_t> *)&process_status::ppid,
                 psVar4);
      std::__cxx11::string::~string((string *)&stat);
      __cxa_atexit(std::
                   __shared_ptr<ylt::metric::basic_static_gauge<long>,_(__gnu_cxx::_Lock_policy)2>::
                   ~__shared_ptr,&process_status::ppid,&__dso_handle);
      __cxa_guard_release(&process_status()::ppid);
    }
  }
  if (process_status()::pgrp == '\0') {
    iVar1 = __cxa_guard_acquire(&process_status()::pgrp);
    if (iVar1 != 0) {
      psVar4 = (string *)static_metric_manager<ylt::metric::ylt_system_tag_t>::instance();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&stat,"ylt_pgrp",(allocator<char> *)&stream_file);
      static_metric_manager<ylt::metric::ylt_system_tag_t>::
      get_metric_static<ylt::metric::basic_static_gauge<long>>
                ((static_metric_manager<ylt::metric::ylt_system_tag_t> *)&process_status::pgrp,
                 psVar4);
      std::__cxx11::string::~string((string *)&stat);
      __cxa_atexit(std::
                   __shared_ptr<ylt::metric::basic_static_gauge<long>,_(__gnu_cxx::_Lock_policy)2>::
                   ~__shared_ptr,&process_status::pgrp,&__dso_handle);
      __cxa_guard_release(&process_status()::pgrp);
    }
  }
  if (process_status()::thread_count == '\0') {
    iVar1 = __cxa_guard_acquire(&process_status()::thread_count);
    if (iVar1 != 0) {
      psVar4 = (string *)static_metric_manager<ylt::metric::ylt_system_tag_t>::instance();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&stat,"ylt_thread_count",(allocator<char> *)&stream_file);
      static_metric_manager<ylt::metric::ylt_system_tag_t>::
      get_metric_static<ylt::metric::basic_static_gauge<long>>
                ((static_metric_manager<ylt::metric::ylt_system_tag_t> *)
                 &process_status::thread_count,psVar4);
      std::__cxx11::string::~string((string *)&stat);
      __cxa_atexit(std::
                   __shared_ptr<ylt::metric::basic_static_gauge<long>,_(__gnu_cxx::_Lock_policy)2>::
                   ~__shared_ptr,&process_status::thread_count,&__dso_handle);
      __cxa_guard_release(&process_status()::thread_count);
    }
  }
  stat.priority = 0;
  stat.nice = 0;
  stat.cutime = 0;
  stat.cstime = 0;
  stat.utime = 0;
  stat.stime = 0;
  stat.majflt = 0;
  stat.cmajflt = 0;
  stat.minflt = 0;
  stat.cminflt = 0;
  stat.session = 0;
  stat.tty_nr = 0;
  stat.tpgid = 0;
  stat.flags = 0;
  stat.pid = 0;
  stat.state = '\0';
  stat._5_3_ = 0;
  stat.ppid = 0;
  stat.pgrp = 0;
  stat.num_threads = 0;
  pFVar2 = fopen("/proc/self/stat","r");
  std::__shared_ptr<_IO_FILE,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<_IO_FILE,ylt::metric::detail::process_status()::_lambda(_IO_FILE*)_1_,void>
            ((__shared_ptr<_IO_FILE,(__gnu_cxx::_Lock_policy)2> *)&stream_file,pFVar2);
  if (stream_file.super___shared_ptr<_IO_FILE,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    iVar1 = __isoc99_fscanf(stream_file.super___shared_ptr<_IO_FILE,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr,
                            "%d %*s %c %d %d %d %d %d %u %lu %lu %lu %lu %lu %lu %lu %lu %ld %ld %ld"
                            ,&stat,&stat.state,&stat.ppid,&stat.pgrp,&stat.session,&stat.tty_nr,
                            &stat.tpgid,&stat.flags,&stat.minflt,&stat.cminflt,&stat.majflt,
                            &stat.cmajflt,&stat.utime,&stat.stime,&stat.cutime,&stat.cstime,
                            &stat.priority,&stat.nice,&stat.num_threads);
    if (iVar1 == 0x13) {
      paVar3 = thread_local_value<long>::local_value
                         (&(process_status::process_uptime.
                            super___shared_ptr<ylt::metric::basic_static_counter<long>,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr)->default_label_value_);
      LOCK();
      (paVar3->super___atomic_base<long>)._M_i = (paVar3->super___atomic_base<long>)._M_i + 1;
      UNLOCK();
      basic_static_counter<long>::update
                (&(process_status::process_priority.
                   super___shared_ptr<ylt::metric::basic_static_gauge<long>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr)->super_basic_static_counter<long>,stat.priority);
      basic_static_counter<long>::update
                (&(process_status::pid.
                   super___shared_ptr<ylt::metric::basic_static_gauge<long>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr)->super_basic_static_counter<long>,(long)stat.pid);
      basic_static_counter<long>::update
                (&(process_status::ppid.
                   super___shared_ptr<ylt::metric::basic_static_gauge<long>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr)->super_basic_static_counter<long>,(long)stat.ppid);
      basic_static_counter<long>::update
                (&(process_status::pgrp.
                   super___shared_ptr<ylt::metric::basic_static_gauge<long>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr)->super_basic_static_counter<long>,(long)stat.pgrp);
      basic_static_counter<long>::update
                (&(process_status::thread_count.
                   super___shared_ptr<ylt::metric::basic_static_gauge<long>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr)->super_basic_static_counter<long>,stat.num_threads);
    }
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&stream_file.super___shared_ptr<_IO_FILE,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

inline void process_status() {
  static auto process_uptime =
      system_metric_manager::instance().get_metric_static<counter_t>(
          "ylt_process_uptime");
  static auto process_priority =
      system_metric_manager::instance().get_metric_static<gauge_t>(
          "ylt_process_priority");
  static auto pid =
      system_metric_manager::instance().get_metric_static<gauge_t>("ylt_pid");
  static auto ppid =
      system_metric_manager::instance().get_metric_static<gauge_t>("ylt_ppid");
  static auto pgrp =
      system_metric_manager::instance().get_metric_static<gauge_t>("ylt_pgrp");
  static auto thread_count =
      system_metric_manager::instance().get_metric_static<gauge_t>(
          "ylt_thread_count");

  ProcStat stat{};
#if defined(__linux__)
  auto stream_file =
      std::shared_ptr<FILE>(fopen("/proc/self/stat", "r"), [](FILE* ptr) {
        fclose(ptr);
      });
  if (stream_file == nullptr) {
    return;
  }

  if (fscanf(stream_file.get(),
             "%d %*s %c "
             "%d %d %d %d %d "
             "%u %lu %lu %lu "
             "%lu %lu %lu %lu %lu "
             "%ld %ld %ld",
             &stat.pid, &stat.state, &stat.ppid, &stat.pgrp, &stat.session,
             &stat.tty_nr, &stat.tpgid, &stat.flags, &stat.minflt,
             &stat.cminflt, &stat.majflt, &stat.cmajflt, &stat.utime,
             &stat.stime, &stat.cutime, &stat.cstime, &stat.priority,
             &stat.nice, &stat.num_threads) != 19) {
    return;
  }
#elif defined(__APPLE__)
  static pid_t proc_id = getpid();
  std::ostringstream oss;
  char cmdbuf[128];
  snprintf(cmdbuf, sizeof(cmdbuf),
           "ps -p %ld -o pid,ppid,pgid,sess"
           ",tpgid,flags,pri,nice | tail -n1",
           (long)proc_id);
  if (read_command_output_through_popen(oss, cmdbuf) != 0) {
    return;
  }
  const std::string &result = oss.str();
  if (sscanf(result.c_str(),
             "%d %d %d %d"
             "%d %u %ld %ld",
             &stat.pid, &stat.ppid, &stat.pgrp, &stat.session, &stat.tpgid,
             &stat.flags, &stat.priority, &stat.nice) != 8) {
    return;
  }
#endif
  process_uptime->inc();
  process_priority->update(stat.priority);
  pid->update(stat.pid);
  ppid->update(stat.ppid);
  pgrp->update(stat.pgrp);
  thread_count->update(stat.num_threads);
}